

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asdcp-test.cpp
# Opt level: O2

FileInfoWrapper<ASDCP::PCM::MXFReader,_MyAudioDescriptor> * __thiscall
FileInfoWrapper<ASDCP::PCM::MXFReader,_MyAudioDescriptor>::file_info
          (FileInfoWrapper<ASDCP::PCM::MXFReader,_MyAudioDescriptor> *this,CommandOptions *Options,
          char *type_string,IFileReaderFactory *fileReaderFactory,FILE *stream)

{
  MXFReader Reader;
  MyAudioDescriptor Desc;
  WriterInfo WI;
  allocator<char> local_189;
  undefined1 local_188 [16];
  AudioDescriptor local_178;
  WriterInfo local_148;
  
  if (type_string != (char *)0x0) {
    if (stream == (FILE *)0x0) {
      stream = (FILE *)_stdout;
    }
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_OK);
    if ((Options->verbose_flag != false) || (Options->showheader_flag == true)) {
      ASDCP::PCM::MXFReader::MXFReader((MXFReader *)local_188,fileReaderFactory);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)(local_188 + 0x10),Options->filenames[0],&local_189);
      ASDCP::PCM::MXFReader::OpenRead((string *)&local_148);
      Kumu::Result_t::operator=((Result_t *)this,(Result_t *)&local_148);
      Kumu::Result_t::~Result_t((Result_t *)&local_148);
      std::__cxx11::string::~string((string *)(local_188 + 0x10));
      if (*(int *)this < 0) {
        if ((*(int *)this == ASDCP::RESULT_FORMAT) && (Options->showheader_flag == true)) {
          ASDCP::PCM::MXFReader::DumpHeaderMetadata((_IO_FILE *)local_188);
        }
      }
      else {
        fprintf(_stdout,"File essence type is %s.\n",type_string);
        if (Options->showheader_flag == true) {
          ASDCP::PCM::MXFReader::DumpHeaderMetadata((_IO_FILE *)local_188);
        }
        ASDCP::WriterInfo::WriterInfo(&local_148);
        ASDCP::PCM::MXFReader::FillWriterInfo((WriterInfo *)&stack0xffffffffffffff68);
        Kumu::Result_t::~Result_t((Result_t *)&stack0xffffffffffffff68);
        ASDCP::WriterInfoDump(&local_148,(_IO_FILE *)stream);
        local_178.EditRate = (Rational)0x0;
        local_178.AudioSamplingRate = (Rational)0x0;
        MyAudioDescriptor::FillDescriptor
                  ((MyAudioDescriptor *)(local_188 + 0x10),(MXFReader *)local_188);
        ASDCP::PCM::AudioDescriptorDump((AudioDescriptor *)(local_188 + 0x10),(_IO_FILE *)stream);
        if (Options->showindex_flag == true) {
          ASDCP::PCM::MXFReader::DumpIndex((_IO_FILE *)local_188);
        }
        ASDCP::WriterInfo::~WriterInfo(&local_148);
      }
      ASDCP::PCM::MXFReader::~MXFReader((MXFReader *)local_188);
    }
    return this;
  }
  __assert_fail("type_string",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/asdcp-test.cpp"
                ,0x6f0,
                "static Result_t FileInfoWrapper<ASDCP::PCM::MXFReader, MyAudioDescriptor>::file_info(CommandOptions &, const char *, const Kumu::IFileReaderFactory &, FILE *) [ReaderT = ASDCP::PCM::MXFReader, DescriptorT = MyAudioDescriptor]"
               );
}

Assistant:

static Result_t
  file_info(CommandOptions& Options, const char* type_string, const Kumu::IFileReaderFactory& fileReaderFactory, FILE* stream = 0)
  {
    assert(type_string);
    if ( stream == 0 )
      stream = stdout;

    Result_t result = RESULT_OK;

    if ( Options.verbose_flag || Options.showheader_flag )
      {
	ReaderT     Reader(fileReaderFactory);
	result = Reader.OpenRead(Options.filenames[0]);

	if ( ASDCP_SUCCESS(result) )
	  {
	    fprintf(stdout, "File essence type is %s.\n", type_string);

	    if ( Options.showheader_flag )
	      Reader.DumpHeaderMetadata(stream);

	    WriterInfo WI;
	    Reader.FillWriterInfo(WI);
	    WriterInfoDump(WI, stream);

	    DescriptorT Desc;
	    Desc.FillDescriptor(Reader);
	    Desc.Dump(stream);

	    if ( Options.showindex_flag )
	      Reader.DumpIndex(stream);
	  }
	else if ( result == RESULT_FORMAT && Options.showheader_flag )
	  {
	    Reader.DumpHeaderMetadata(stream);
	  }
      }

    return result;
  }